

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Probe.cpp
# Opt level: O3

void __thiscall
helics::apps::Probe::Probe
          (Probe *this,string_view appName,shared_ptr<helics::Core> *core,FederateInfo *fedInfo)

{
  apps::App::App(&this->super_App,(string_view)appName,(shared_ptr<helics::Core> *)core,fedInfo);
  (this->super_App)._vptr_App = (_func_int **)&PTR__Probe_00546b08;
  (this->endpoint).super_Interface.mCore = (Core *)0x0;
  (this->endpoint).super_Interface.handle.hid = -1700000000;
  (this->endpoint).super_Interface.mName._M_dataplus._M_p =
       (pointer)&(this->endpoint).super_Interface.mName.field_2;
  (this->endpoint).super_Interface.mName._M_string_length = 0;
  (this->endpoint).super_Interface.mName.field_2._M_local_buf[0] = '\0';
  (this->endpoint).super_Interface._vptr_Interface = (_func_int **)&PTR__Endpoint_0053f0b8;
  (this->endpoint).fed = (MessageFederate *)0x0;
  (this->endpoint).referenceIndex = -1;
  (this->endpoint).dataReference = (void *)0x0;
  (this->endpoint).disableAssign = false;
  (this->endpoint).receiveOnly = false;
  (this->endpoint).defDest._M_dataplus._M_p = (pointer)&(this->endpoint).defDest.field_2;
  (this->endpoint).defDest._M_string_length = 0;
  (this->endpoint).defDest.field_2._M_local_buf[0] = '\0';
  this->connections = 0;
  this->messagesReceived = 0;
  return;
}

Assistant:

Probe::Probe(std::string_view appName,
             const std::shared_ptr<Core>& core,
             const FederateInfo& fedInfo): App(appName, core, fedInfo)
{
}